

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

void poly1305_first_block(poly1305_state_internal *st,uint8_t *m)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 v [16];
  undefined1 a_03 [16];
  undefined1 a_04 [16];
  undefined1 v_00 [16];
  undefined1 a_05 [16];
  undefined1 a_06 [16];
  undefined1 v_01 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  undefined1 b_01 [16];
  uint uVar13;
  uint128_t *__return_storage_ptr__;
  uint128_t *puVar14;
  uint128_t *__return_storage_ptr___00;
  uint128_t *puVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  ulong uVar19;
  uint64_t uVar20;
  ulong uVar21;
  uint64_t in_RDX;
  uint64_t b_02;
  uint64_t b_03;
  uint64_t b_04;
  uint64_t b_05;
  uint64_t b_06;
  uint64_t b_07;
  uint64_t extraout_RDX;
  ulong uVar22;
  uint64_t in_stack_fffffffffffff9d8;
  uint128_t *in_stack_fffffffffffff9e0;
  ulong local_460;
  uint64_t i;
  uint64_t c;
  uint64_t pad1;
  uint64_t pad0;
  uint64_t s22;
  uint64_t r22;
  uint64_t r21;
  uint64_t r20;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint128_t d [3];
  poly1305_state_internal *local_3d0;
  poly1305_power *p;
  xmmi T6;
  xmmi T5;
  xmmi HIBIT;
  xmmi FIVE;
  xmmi MMASK;
  uint8_t *m_local;
  poly1305_state_internal *st_local;
  
  local_3d0 = (poly1305_state_internal *)(st->P + 1);
  uVar3 = st->P[1].R20.d[3];
  uVar4 = st->P[1].R20.d[1];
  r21 = CONCAT44(uVar3,uVar4);
  uVar5 = st->P[1].R21.d[3];
  uVar6 = st->P[1].R21.d[1];
  uVar7 = st->P[1].R22.d[3];
  uVar8 = st->P[1].R22.d[1];
  uVar9 = st->P[1].R23.d[3];
  uVar10 = st->P[1].R23.d[1];
  uVar11 = st->P[1].R24.d[3];
  uVar12 = st->P[1].R24.d[1];
  s22 = CONCAT44(uVar7,uVar8);
  r22 = CONCAT44(uVar5,uVar6);
  for (local_460 = 0; local_460 < 2; local_460 = local_460 + 1) {
    __return_storage_ptr__ = mul64x64_128((uint128_t *)r21,r21,in_RDX);
    uVar20 = b_02;
    mul64x64_128((uint128_t *)(r22 * 2),s22 * 0x14,b_02);
    a._8_8_ = __return_storage_ptr__;
    a._0_8_ = uVar20;
    b._8_8_ = in_stack_fffffffffffff9e0;
    b._0_8_ = in_stack_fffffffffffff9d8;
    puVar14 = add128(__return_storage_ptr__,(uint128_t)a,(uint128_t)b);
    in_stack_fffffffffffff9e0 = mul64x64_128((uint128_t *)s22,s22 * 0x14,b_03);
    in_stack_fffffffffffff9d8 = b_04;
    mul64x64_128((uint128_t *)(r21 * 2),r22,b_04);
    a_00._8_8_ = __return_storage_ptr__;
    a_00._0_8_ = uVar20;
    b_00._8_8_ = in_stack_fffffffffffff9e0;
    b_00._0_8_ = in_stack_fffffffffffff9d8;
    __return_storage_ptr___00 = add128(in_stack_fffffffffffff9e0,(uint128_t)a_00,(uint128_t)b_00);
    puVar15 = mul64x64_128((uint128_t *)r22,r22,b_05);
    mul64x64_128((uint128_t *)(s22 * 2),r21,b_06);
    a_01._8_8_ = __return_storage_ptr__;
    a_01._0_8_ = uVar20;
    b_01._8_8_ = in_stack_fffffffffffff9e0;
    b_01._0_8_ = in_stack_fffffffffffff9d8;
    puVar15 = add128(puVar15,(uint128_t)a_01,(uint128_t)b_01);
    a_02._8_8_ = __return_storage_ptr__;
    a_02._0_8_ = uVar20;
    uVar16 = lo128((uint128_t)a_02);
    v._8_8_ = __return_storage_ptr__;
    v._0_8_ = uVar20;
    shr128((uint128_t)v,(int)puVar14);
    a_03._8_8_ = __return_storage_ptr__;
    a_03._0_8_ = uVar20;
    puVar14 = add128_64(__return_storage_ptr___00,(uint128_t)a_03,b_05);
    a_04._8_8_ = __return_storage_ptr__;
    a_04._0_8_ = uVar20;
    uVar17 = lo128((uint128_t)a_04);
    v_00._8_8_ = __return_storage_ptr__;
    v_00._0_8_ = uVar20;
    shr128((uint128_t)v_00,(int)puVar14);
    a_05._8_8_ = __return_storage_ptr__;
    a_05._0_8_ = uVar20;
    puVar14 = add128_64(puVar15,(uint128_t)a_05,b_07);
    a_06._8_8_ = __return_storage_ptr__;
    a_06._0_8_ = uVar20;
    uVar18 = lo128((uint128_t)a_06);
    uVar19 = uVar18 & 0x3ffffffffff;
    v_01._8_8_ = __return_storage_ptr__;
    v_01._0_8_ = uVar20;
    uVar20 = shr128((uint128_t)v_01,(int)puVar14);
    uVar21 = (uVar16 & 0xfffffffffff) + uVar20 * 5;
    r21 = uVar21 & 0xfffffffffff;
    uVar20 = (uVar17 & 0xfffffffffff) + (uVar21 >> 0x2c);
    local_3d0->P[0].R20.d[0] = (uint)r21 & 0x3ffffff;
    local_3d0->P[0].R20.d[1] = 0;
    local_3d0->P[0].R20.d[2] = (uint)r21 & 0x3ffffff;
    local_3d0->P[0].R20.d[3] = 0;
    r22._0_4_ = (uint)uVar20;
    uVar13 = (uint)(r21 >> 0x1a) | ((uint)r22 & 0xff) << 0x12;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x10)
    )->d[0] = uVar13;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x14)
    )->d[0] = 0;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x18)
    )->d[0] = uVar13;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x1c)
    )->d[0] = 0;
    r22._1_4_ = (uint)(uVar20 >> 8);
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x20)
    )->d[0] = r22._1_4_ & 0x3ffffff;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x24)
    )->d[0] = 0;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x28)
    )->d[0] = r22._1_4_ & 0x3ffffff;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x2c)
    )->d[0] = 0;
    s22._0_4_ = (uint)uVar19;
    uVar13 = (uint)(uVar20 >> 0x22) | ((uint)s22 & 0xffff) << 10;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x30)
    )->d[0] = uVar13;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x34)
    )->d[0] = 0;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x38)
    )->d[0] = uVar13;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x3c)
    )->d[0] = 0;
    s22._2_4_ = (uint32_t)(uVar19 >> 0x10);
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x40)
    )->d[0] = s22._2_4_;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x44)
    )->d[0] = 0;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x48)
    )->d[0] = s22._2_4_;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x4c)
    )->d[0] = 0;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x50)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x10))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x58)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x18))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x60)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x20))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x68)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x28))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x70)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x30))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x78)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x38))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x80)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x40))->u[0] & 0xffffffff) * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)local_3d0->P + 0x88)
    )->v[0] = (((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)
               ((long)local_3d0->P + 0x48))->u[0] & 0xffffffff) * 5;
    local_3d0 = (poly1305_state_internal *)((long)(local_3d0 + 0xffffffffffffffff) + 0x130);
    in_RDX = extraout_RDX;
    s22 = uVar19;
    r22 = uVar20;
  }
  st->P[1].R20.d[1] = uVar4;
  st->P[1].R20.d[3] = uVar3;
  st->P[1].R21.d[1] = uVar6;
  st->P[1].R21.d[3] = uVar5;
  st->P[1].R22.d[1] = uVar8;
  st->P[1].R22.d[3] = uVar7;
  st->P[1].R23.d[1] = uVar10;
  st->P[1].R23.d[3] = uVar9;
  st->P[1].R24.d[1] = uVar12;
  st->P[1].R24.d[3] = uVar11;
  uVar19 = *(ulong *)m;
  uVar21 = *(ulong *)(m + 0x10);
  uVar1 = *(ulong *)(m + 8);
  uVar2 = *(ulong *)(m + 0x18);
  (st->field_1).HH[0] = uVar19 & 0x3ffffff;
  (st->field_1).HH[1] = uVar21 & 0x3ffffff;
  (st->field_1).HH[2] = uVar19 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[3] = uVar21 >> 0x1a & 0x3ffffff;
  uVar22 = uVar1 << 0xc;
  (st->field_1).HH[4] = uVar19 >> 0x34 | uVar22 & 0x3ffffff;
  (st->field_1).HH[5] = uVar21 >> 0x34 | uVar2 & 0x3ffffff;
  (st->field_1).HH[6] = uVar22 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[7] = uVar2 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[8] = uVar1 >> 0x28 | 0x1000000;
  (st->field_1).HH[9] = uVar2 >> 0x28 | 0x1000000;
  return;
}

Assistant:

static void poly1305_first_block(poly1305_state_internal *st,
                                 const uint8_t *m) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);
  xmmi T5, T6;
  poly1305_power *p;
  uint128_t d[3];
  uint64_t r0, r1, r2;
  uint64_t r20, r21, r22, s22;
  uint64_t pad0, pad1;
  uint64_t c;
  uint64_t i;

  // pull out stored info
  p = &st->P[1];

  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  pad0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  pad1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];

  // compute powers r^2,r^4
  r20 = r0;
  r21 = r1;
  r22 = r2;
  for (i = 0; i < 2; i++) {
    s22 = r22 * (5 << 2);

    d[0] = add128(mul64x64_128(r20, r20), mul64x64_128(r21 * 2, s22));
    d[1] = add128(mul64x64_128(r22, s22), mul64x64_128(r20 * 2, r21));
    d[2] = add128(mul64x64_128(r21, r21), mul64x64_128(r22 * 2, r20));

    r20 = lo128(d[0]) & 0xfffffffffff;
    c = shr128(d[0], 44);
    d[1] = add128_64(d[1], c);
    r21 = lo128(d[1]) & 0xfffffffffff;
    c = shr128(d[1], 44);
    d[2] = add128_64(d[2], c);
    r22 = lo128(d[2]) & 0x3ffffffffff;
    c = shr128(d[2], 42);
    r20 += c * 5;
    c = (r20 >> 44);
    r20 = r20 & 0xfffffffffff;
    r21 += c;

    p->R20.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)(r20) & 0x3ffffff),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->R21.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r20 >> 26) | (r21 << 18)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R22.v =
        _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r21 >> 8)) & 0x3ffffff),
                          _MM_SHUFFLE(1, 0, 1, 0));
    p->R23.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r21 >> 34) | (r22 << 10)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R24.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r22 >> 16))),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->S21.v = _mm_mul_epu32(p->R21.v, FIVE);
    p->S22.v = _mm_mul_epu32(p->R22.v, FIVE);
    p->S23.v = _mm_mul_epu32(p->R23.v, FIVE);
    p->S24.v = _mm_mul_epu32(p->R24.v, FIVE);
    p--;
  }

  // put saved info back
  p = &st->P[1];
  p->R20.d[1] = (uint32_t)(r0);
  p->R20.d[3] = (uint32_t)(r0 >> 32);
  p->R21.d[1] = (uint32_t)(r1);
  p->R21.d[3] = (uint32_t)(r1 >> 32);
  p->R22.d[1] = (uint32_t)(r2);
  p->R22.d[3] = (uint32_t)(r2 >> 32);
  p->R23.d[1] = (uint32_t)(pad0);
  p->R23.d[3] = (uint32_t)(pad0 >> 32);
  p->R24.d[1] = (uint32_t)(pad1);
  p->R24.d[3] = (uint32_t)(pad1 >> 32);

  // H = [Mx,My]
  T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                          _mm_loadl_epi64((const xmmi *)(m + 16)));
  T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                          _mm_loadl_epi64((const xmmi *)(m + 24)));
  st->H[0] = _mm_and_si128(MMASK, T5);
  st->H[1] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
  st->H[2] = _mm_and_si128(MMASK, T5);
  st->H[3] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  st->H[4] = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);
}